

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.h
# Opt level: O3

future<dap::ResponseOrError<dap::SetBreakpointsResponse>_> __thiscall
dap::Session::send<dap::SetBreakpointsRequest,void>(Session *this,SetBreakpointsRequest *request)

{
  optional<dap::integer> *__s;
  bool *pbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  element_type *peVar3;
  char cVar4;
  pointer this_00;
  TypeInfo *pTVar5;
  TypeInfo *pTVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  future<dap::ResponseOrError<dap::SetBreakpointsResponse>_> fVar7;
  Error local_c8;
  vector<dap::Breakpoint,_std::allocator<dap::Breakpoint>_> local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  bool *local_68;
  element_type *local_60;
  unique_lock<std::mutex> local_58;
  vector<dap::Breakpoint,_std::allocator<dap::Breakpoint>_> local_48;
  
  local_60 = (element_type *)this;
  this_00 = (pointer)operator_new(0xa8);
  *(undefined8 *)&(this_00->column).set = 0x100000001;
  (this_00->column).val.val = (int64_t)&PTR___Sp_counted_ptr_inplace_00bb87b0;
  __s = &this_00->endColumn;
  memset(__s,0,0x98);
  *(bool **)&(this_00->endLine).set = &(this_00->id).set;
  (this_00->instructionReference).val._M_string_length = 0;
  (this_00->instructionReference).val.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this_00->instructionReference).val.field_2 + 8) = 0;
  *(undefined8 *)&(this_00->instructionReference).set = 0;
  (this_00->line).val.val = 0;
  local_68 = &(this_00->line).set;
  std::condition_variable::condition_variable((condition_variable *)local_68);
  *(undefined1 *)&(this_00->offset).val.val = 0;
  pTVar5 = TypeOf<dap::SetBreakpointsRequest>::type();
  pTVar6 = TypeOf<dap::SetBreakpointsResponse>::type();
  if (__libc_single_threaded == '\0') {
    LOCK();
    pbVar1 = &(this_00->column).set;
    *(int *)pbVar1 = *(int *)pbVar1 + 1;
    UNLOCK();
  }
  else {
    pbVar1 = &(this_00->column).set;
    *(int *)pbVar1 = *(int *)pbVar1 + 1;
  }
  local_a8.super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x10);
  ((local_a8.super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
    super__Vector_impl_data._M_start)->column).val.val = (int64_t)__s;
  *(pointer *)
   &((local_a8.super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
      super__Vector_impl_data._M_start)->column).set = this_00;
  local_90 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)std::
                _Function_handler<void_(const_void_*,_const_dap::Error_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/session.h:422:20)>
                ::_M_invoke;
  local_a8.super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(const_void_*,_const_dap::Error_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/session.h:422:20)>
                ::_M_manager;
  cVar4 = (**(code **)((long)&((request->breakpoints).val.
                               super__Vector_base<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>
                               ._M_impl.super__Vector_impl_data._M_start)->hitCondition + 0x18))
                    (request,pTVar5,pTVar6);
  if (local_a8.super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    (*(code *)local_a8.super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage)(&local_a8,&local_a8,3);
  }
  if (cVar4 == '\0') {
    Error::Error(&local_c8,"Failed to send request");
    local_58._M_device = (mutex_type *)&(this_00->instructionReference).val._M_string_length;
    local_90 = &local_80;
    local_a8.super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    paVar2 = &local_c8.message.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.message._M_dataplus._M_p == paVar2) {
      local_80._8_8_ = local_c8.message.field_2._8_8_;
    }
    else {
      local_90 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_c8.message._M_dataplus._M_p;
    }
    local_80._M_allocated_capacity._1_7_ = local_c8.message.field_2._M_allocated_capacity._1_7_;
    local_80._M_local_buf[0] = local_c8.message.field_2._M_local_buf[0];
    local_88 = local_c8.message._M_string_length;
    local_c8.message._M_string_length = 0;
    local_c8.message.field_2._M_local_buf[0] = '\0';
    local_58._M_owns = false;
    local_c8.message._M_dataplus._M_p = (pointer)paVar2;
    std::unique_lock<std::mutex>::lock(&local_58);
    local_58._M_owns = true;
    local_48.super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)(this_00->endLine).val.val;
    (this_00->endLine).val.val =
         (int64_t)local_a8.super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_48.super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)(this_00->endColumn).val.val;
    local_48.super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
    super__Vector_impl_data._M_finish = *(pointer *)&(this_00->endColumn).set;
    (this_00->endColumn).val.val =
         (int64_t)local_a8.super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    *(pointer *)&(this_00->endColumn).set =
         local_a8.super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_a8.super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>::~vector(&local_48);
    std::__cxx11::string::operator=((string *)&(this_00->endLine).set,(string *)&local_90);
    *(undefined1 *)&(this_00->offset).val.val = 1;
    std::condition_variable::notify_all();
    std::unique_lock<std::mutex>::~unique_lock(&local_58);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80._M_allocated_capacity + 1);
    }
    std::vector<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>::~vector(&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.message._M_dataplus._M_p != &local_c8.message.field_2) {
      operator_delete(local_c8.message._M_dataplus._M_p,
                      CONCAT71(local_c8.message.field_2._M_allocated_capacity._1_7_,
                               local_c8.message.field_2._M_local_buf[0]) + 1);
    }
  }
  peVar3 = local_60;
  (local_60->val).response.breakpoints.
  super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)__s;
  (local_60->val).response.breakpoints.
  super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
  super__Vector_impl_data._M_finish = this_00;
  if (__libc_single_threaded == '\0') {
    LOCK();
    pbVar1 = &(this_00->column).set;
    *(int *)pbVar1 = *(int *)pbVar1 + 1;
    UNLOCK();
  }
  else {
    pbVar1 = &(this_00->column).set;
    *(int *)pbVar1 = *(int *)pbVar1 + 1;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
  fVar7.state.
  super___shared_ptr<dap::detail::promise_state<dap::ResponseOrError<dap::SetBreakpointsResponse>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  fVar7.state.
  super___shared_ptr<dap::detail::promise_state<dap::ResponseOrError<dap::SetBreakpointsResponse>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar3;
  return (future<dap::ResponseOrError<dap::SetBreakpointsResponse>_>)
         fVar7.state.
         super___shared_ptr<dap::detail::promise_state<dap::ResponseOrError<dap::SetBreakpointsResponse>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

future<ResponseOrError<typename T::Response>> Session::send(const T& request) {
  using Response = typename T::Response;
  promise<ResponseOrError<Response>> promise;
  auto sent = send(TypeOf<T>::type(), TypeOf<Response>::type(), &request,
                   [=](const void* result, const Error* error) {
                     if (error != nullptr) {
                       promise.set_value(ResponseOrError<Response>(*error));
                     } else {
                       promise.set_value(ResponseOrError<Response>(
                           *reinterpret_cast<const Response*>(result)));
                     }
                   });
  if (!sent) {
    promise.set_value(Error("Failed to send request"));
  }
  return promise.get_future();
}